

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::UnaryExpression::propagateType
          (UnaryExpression *this,ASTContext *context,Type *newType,SourceRange propRange,
          ConversionKind param_5)

{
  SourceRange opRange;
  Expression **in_RCX;
  Type *in_RSI;
  Expression *in_RDI;
  ASTContext *in_R8;
  bool bVar1;
  SourceLocation unaff_retaddr;
  ConversionKind in_stack_00000010;
  Type *local_48;
  not_null<const_slang::ast::Type_*> local_40 [3];
  Expression *parentExpr;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = in_RDI[1].kind < TimeLiteral;
  if (bVar1) {
    parentExpr = in_RDI;
    not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(local_40,&local_48);
    (in_RDI->type).ptr = local_40[0].ptr;
    opRange.startLoc._7_1_ = in_stack_ffffffffffffffff;
    opRange.startLoc._0_7_ = in_stack_fffffffffffffff8;
    opRange.endLoc = unaff_retaddr;
    Expression::contextDetermined(in_R8,in_RCX,parentExpr,in_RSI,opRange,in_stack_00000010);
  }
  return bVar1;
}

Assistant:

bool UnaryExpression::propagateType(const ASTContext& context, const Type& newType,
                                    SourceRange propRange, ConversionKind) {
    switch (op) {
        case UnaryOperator::Plus:
        case UnaryOperator::Minus:
        case UnaryOperator::BitwiseNot:
            type = &newType;
            contextDetermined(context, operand_, this, newType, propRange);
            return true;
        case UnaryOperator::BitwiseAnd:
        case UnaryOperator::BitwiseOr:
        case UnaryOperator::BitwiseXor:
        case UnaryOperator::BitwiseNand:
        case UnaryOperator::BitwiseNor:
        case UnaryOperator::BitwiseXnor:
        case UnaryOperator::LogicalNot:
        case UnaryOperator::Preincrement:
        case UnaryOperator::Predecrement:
        case UnaryOperator::Postincrement:
        case UnaryOperator::Postdecrement:
            // Operand is self determined and already folded.
            return false;
    }
    SLANG_UNREACHABLE;
}